

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O1

void Abc_SclWriteSurfaceText(FILE *s,SC_Surface *p)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  fwrite("          index_1(\"",0x13,1,(FILE *)s);
  uVar1 = (p->vIndex0).nSize;
  uVar3 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      pcVar4 = "    \"%s\", ";
      if (uVar5 == (int)uVar3 - 1) {
        pcVar4 = "T = %d\t\t";
      }
      fprintf((FILE *)s,"%f%s",(double)(p->vIndex0).pArray[uVar5],pcVar4 + 8);
      uVar5 = uVar5 + 1;
      uVar3 = (ulong)(p->vIndex0).nSize;
    } while ((long)uVar5 < (long)uVar3);
  }
  fwrite("\");\n",4,1,(FILE *)s);
  fwrite("          index_2(\"",0x13,1,(FILE *)s);
  uVar1 = (p->vIndex1).nSize;
  uVar3 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      pcVar4 = "    \"%s\", ";
      if (uVar5 == (int)uVar3 - 1) {
        pcVar4 = "T = %d\t\t";
      }
      fprintf((FILE *)s,"%f%s",(double)(p->vIndex1).pArray[uVar5],pcVar4 + 8);
      uVar5 = uVar5 + 1;
      uVar3 = (ulong)(p->vIndex1).nSize;
    } while ((long)uVar5 < (long)uVar3);
  }
  fwrite("\");\n",4,1,(FILE *)s);
  fwrite("          values (\"",0x13,1,(FILE *)s);
  if (0 < (p->vData).nSize) {
    uVar3 = 0;
    do {
      pvVar2 = (p->vData).pArray[uVar3];
      uVar5 = (ulong)*(uint *)((long)pvVar2 + 4);
      if (0 < (int)*(uint *)((long)pvVar2 + 4)) {
        uVar6 = 0;
        do {
          pcVar4 = ", ";
          if ((int)uVar5 - 1 == uVar6 && (p->vData).nSize - 1 == uVar3) {
            pcVar4 = "\");";
          }
          fprintf((FILE *)s,"%f%s",(double)*(float *)(*(long *)((long)pvVar2 + 8) + uVar6 * 4),
                  pcVar4);
          uVar6 = uVar6 + 1;
          uVar5 = (ulong)*(int *)((long)pvVar2 + 4);
        } while ((long)uVar6 < (long)uVar5);
      }
      if (uVar3 == (p->vData).nSize - 1) {
        fputc(10,(FILE *)s);
      }
      else {
        fwrite("\\\n",2,1,(FILE *)s);
        fwrite("                   ",0x13,1,(FILE *)s);
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)(p->vData).nSize);
  }
  return;
}

Assistant:

static void Abc_SclWriteSurfaceText( FILE * s, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    float Entry;
    int i, k;

    fprintf( s, "          index_1(\"" );  
    Vec_FltForEachEntry( &p->vIndex0, Entry, i )
        fprintf( s, "%f%s", Entry, i == Vec_FltSize(&p->vIndex0)-1 ? "":", " );
    fprintf( s, "\");\n" );

    fprintf( s, "          index_2(\"" );  
    Vec_FltForEachEntry( &p->vIndex1, Entry, i )
        fprintf( s, "%f%s", Entry, i == Vec_FltSize(&p->vIndex1)-1 ? "":", " );
    fprintf( s, "\");\n" );

    fprintf( s, "          values (\"" );  
    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vVec, i )
    {
        Vec_FltForEachEntry( vVec, Entry, k )
            fprintf( s, "%f%s", Entry, i == Vec_PtrSize(&p->vData)-1 && k == Vec_FltSize(vVec)-1 ? "\");":", " );
        if ( i == Vec_PtrSize(&p->vData)-1 )
            fprintf( s, "\n" );
        else
        {
            fprintf( s, "\\\n" );
            fprintf( s, "                   " );  
        }
    }
/*
    fprintf( s, "       approximations: \n" );
    fprintf( s, "       " );
    for ( i = 0; i < 3; i++ ) 
        fprintf( s, "%f ", p->approx[0][i] );
    fprintf( s, "\n" );
    fprintf( s, "       " );
    for ( i = 0; i < 4; i++ ) 
        fprintf( s, "%f ", p->approx[1][i] );
    fprintf( s, "\n" );
    fprintf( s, "       " );
    for ( i = 0; i < 6; i++ ) 
        fprintf( s, "%f ", p->approx[2][i] );
    fprintf( s, "\n" );
    fprintf( s, "       \n" );
*/
}